

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

int exception_target_el(CPUARMState_conflict *env)

{
  _Bool _Var1;
  int iVar2;
  int local_18;
  int local_14;
  int target_el;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  if (iVar2 < 1) {
    local_18 = 1;
  }
  else {
    local_18 = arm_current_el(env);
  }
  local_14 = local_18;
  _Var1 = arm_is_secure(env);
  if (((_Var1) && (_Var1 = arm_el_is_aa64(env,3), !_Var1)) && (local_18 == 1)) {
    local_14 = 3;
  }
  return local_14;
}

Assistant:

static inline int exception_target_el(CPUARMState *env)
{
    int target_el = MAX(1, arm_current_el(env));

    /*
     * No such thing as secure EL1 if EL3 is aarch32,
     * so update the target EL to EL3 in this case.
     */
    if (arm_is_secure(env) && !arm_el_is_aa64(env, 3) && target_el == 1) {
        target_el = 3;
    }

    return target_el;
}